

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rumors.c
# Opt level: O0

void outrumor(int truth,int mechanism)

{
  boolean bVar1;
  int iVar2;
  char *local_130;
  char *local_128;
  char local_118 [7];
  boolean reading;
  char buf [256];
  char *line;
  int mechanism_local;
  int truth_local;
  
  if (mechanism == 1 || mechanism == 2) {
    bVar1 = is_fainted();
    if ((bVar1 != '\0') && (mechanism == 1)) {
      return;
    }
    if (((u.uprops[0x1e].intrinsic != 0) ||
        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
       ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
      if (mechanism == 1) {
        pline("This cookie has a scrap of paper inside.");
      }
      pline("What a pity that you cannot read it!");
      return;
    }
  }
  buf._248_8_ = getrumor(truth,local_118,mechanism != 1 && mechanism != 2);
  if (*(char *)buf._248_8_ == '\0') {
    buf._248_8_ = anon_var_dwarf_5c72;
  }
  if (mechanism == 0) {
    iVar2 = rn2(4);
    if (iVar2 == 0) {
      local_128 = "offhandedly ";
    }
    else {
      iVar2 = rn2(3);
      if (iVar2 == 0) {
        local_130 = "casually ";
      }
      else {
        iVar2 = rn2(2);
        local_130 = "";
        if (iVar2 != 0) {
          local_130 = "nonchalantly ";
        }
      }
      local_128 = local_130;
    }
    pline("True to her word, the Oracle %ssays: ",local_128);
    verbalize("%s",buf._248_8_);
    exercise(2,'\x01');
    return;
  }
  if (mechanism == 1) {
    pline("This cookie has a scrap of paper inside.");
  }
  else if (mechanism != 2) goto LAB_002c2b93;
  pline("It reads:");
LAB_002c2b93:
  pline("%s",buf._248_8_);
  return;
}

Assistant:

void outrumor(int truth, /* 1=true, -1=false, 0=either */
	      int mechanism)
{
	static const char fortune_msg[] =
		"This cookie has a scrap of paper inside.";
	const char *line;
	char buf[BUFSZ];
	boolean reading = (mechanism == BY_COOKIE ||
			   mechanism == BY_PAPER);

	if (reading) {
	    /* deal with various things that prevent reading */
	    if (is_fainted() && mechanism == BY_COOKIE)
	    	return;
	    else if (Blind) {
		if (mechanism == BY_COOKIE)
			pline(fortune_msg);
		pline("What a pity that you cannot read it!");
	    	return;
	    }
	}
	line = getrumor(truth, buf, reading ? FALSE : TRUE);
	if (!*line)
		line = "Rumors file closed for renovation.";
	switch (mechanism) {
	    case BY_ORACLE:
	 	/* Oracle delivers the rumor */
		pline("True to her word, the Oracle %ssays: ",
		  (!rn2(4) ? "offhandedly " : (!rn2(3) ? "casually " :
		  (rn2(2) ? "nonchalantly " : ""))));
		verbalize("%s", line);
		exercise(A_WIS, TRUE);
		return;
	    case BY_COOKIE:
		pline(fortune_msg);
		/* FALLTHRU */
	    case BY_PAPER:
		pline("It reads:");
		break;
	}
	pline("%s", line);
}